

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall
QRegularExpressionPrivate::~QRegularExpressionPrivate(QRegularExpressionPrivate *this)

{
  QRegularExpressionPrivate *in_RDI;
  
  cleanCompiledPattern(in_RDI);
  QString::~QString((QString *)0x14e0fa);
  return;
}

Assistant:

QRegularExpressionPrivate::~QRegularExpressionPrivate()
{
    cleanCompiledPattern();
}